

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O0

Instr * __thiscall
IRBuilder::BuildCallI_Helper
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot Src1RegSlot,
          ArgSlot ArgCount,ProfileId profileId,CallFlags flags,InlineCacheIndex inlineCacheIndex)

{
  short sVar1;
  bool bVar2;
  bool bVar3;
  ValueType valueType;
  RegOpnd *newSrc;
  JitProfilingInstr *pJVar4;
  ProfiledInstr *pPVar5;
  byte local_4a;
  bool profiledReturn;
  StackSym *pSStack_48;
  bool jitProfiling;
  StackSym *symDst;
  RegOpnd *src1Opnd;
  RegOpnd *dstOpnd;
  Instr *instr;
  ArgSlot ArgCount_local;
  RegSlot Src1RegSlot_local;
  RegSlot dstRegSlot_local;
  uint32 offset_local;
  OpCode newOpcode_local;
  IRBuilder *this_local;
  
  newSrc = BuildSrcOpnd(this,Src1RegSlot,TyVar);
  if (dstRegSlot == 0xffffffff) {
    src1Opnd = (RegOpnd *)0x0;
    pSStack_48 = (StackSym *)0x0;
  }
  else {
    src1Opnd = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    pSStack_48 = src1Opnd->m_sym;
  }
  bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
  local_4a = 0;
  bVar3 = Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode);
  dstRegSlot_local._2_2_ = newOpcode;
  if (bVar3) {
    local_4a = 1;
    dstRegSlot_local._2_2_ = Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(newOpcode)
    ;
    if (!bVar2) {
      profileId = 0xffff;
    }
  }
  if (profileId == 0xffff) {
    dstOpnd = (RegOpnd *)IR::Instr::New(dstRegSlot_local._2_2_,this->m_func);
    IR::Instr::SetSrc1((Instr *)dstOpnd,&newSrc->super_Opnd);
    if (src1Opnd != (RegOpnd *)0x0) {
      IR::Instr::SetDst((Instr *)dstOpnd,&src1Opnd->super_Opnd);
    }
  }
  else if (bVar2) {
    dstOpnd = (RegOpnd *)
              IR::JitProfilingInstr::New
                        (dstRegSlot_local._2_2_,&src1Opnd->super_Opnd,&newSrc->super_Opnd,
                         this->m_func);
    pJVar4 = IR::Instr::AsJitProfilingInstr((Instr *)dstOpnd);
    pJVar4->profileId = profileId;
    pJVar4 = IR::Instr::AsJitProfilingInstr((Instr *)dstOpnd);
    pJVar4->field_0x60 = pJVar4->field_0x60 & 0xfe | local_4a;
    pJVar4 = IR::Instr::AsJitProfilingInstr((Instr *)dstOpnd);
    (pJVar4->field_2).inlineCacheIndex = inlineCacheIndex;
  }
  else {
    dstOpnd = (RegOpnd *)
              IR::ProfiledInstr::New
                        (dstRegSlot_local._2_2_,&src1Opnd->super_Opnd,&newSrc->super_Opnd,
                         this->m_func);
    pPVar5 = IR::Instr::AsProfiledInstr((Instr *)dstOpnd);
    *(uint *)&pPVar5->u = (uint)profileId;
  }
  if ((src1Opnd != (RegOpnd *)0x0) && (dstRegSlot_local._2_2_ == NewScObject)) {
    valueType = ValueType::GetObject(UninitializedObject);
    IR::Opnd::SetValueType(&src1Opnd->super_Opnd,valueType);
  }
  if (((pSStack_48 != (StackSym *)0x0) && ((*(uint *)&pSStack_48->field_0x18 & 1) != 0)) &&
     (((sVar1 = *(short *)&dstOpnd[1].m_sym, sVar1 == 0xc4 ||
       (((sVar1 == 199 || (sVar1 == 0xc9)) || (sVar1 == 0xce)))) || (sVar1 == 0x160)))) {
    *(uint *)&pSStack_48->field_0x18 = *(uint *)&pSStack_48->field_0x18 & 0xfffffffb | 4;
    *(uint *)&pSStack_48->field_0x18 = *(uint *)&pSStack_48->field_0x18 & 0xfffffffd | 2;
  }
  AddInstr(this,(Instr *)dstOpnd,offset);
  BuildCallCommon(this,(Instr *)dstOpnd,pSStack_48,ArgCount,flags);
  return (Instr *)dstOpnd;
}

Assistant:

IR::Instr *
IRBuilder::BuildCallI_Helper(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot Src1RegSlot, Js::ArgSlot ArgCount, Js::ProfileId profileId, Js::CallFlags flags, Js::InlineCacheIndex inlineCacheIndex)
{
    IR::Instr * instr;
    IR::RegOpnd *   dstOpnd;
    IR::RegOpnd *   src1Opnd;
    StackSym *      symDst;

    src1Opnd = this->BuildSrcOpnd(Src1RegSlot);
    if (dstRegSlot == Js::Constants::NoRegister)
    {
        dstOpnd = nullptr;
        symDst = nullptr;
    }
    else
    {
        dstOpnd = this->BuildDstOpnd(dstRegSlot);
        symDst = dstOpnd->m_sym;
    }

    const bool jitProfiling = m_func->DoSimpleJitDynamicProfile();
    bool profiledReturn = false;
    if (Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode))
    {
        profiledReturn = true;
        newOpcode = Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(newOpcode);

        // If we're profiling in the jitted code we want to propagate the profileId
        //   If we're using profile data instead of collecting it, we don't want to
        //   use the profile data from a return type call (this was previously done in IRBuilder::BuildProfiledCallI)
        if (!jitProfiling)
        {
            profileId = Js::Constants::NoProfileId;
        }
    }

    if (profileId != Js::Constants::NoProfileId)
    {
        if (jitProfiling)
        {
            // In SimpleJit we want this call to be a profiled call after being jitted
            instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, src1Opnd, m_func);
            instr->AsJitProfilingInstr()->profileId = profileId;
            instr->AsJitProfilingInstr()->isProfiledReturnCall = profiledReturn;
            instr->AsJitProfilingInstr()->inlineCacheIndex = inlineCacheIndex;
        }
        else
        {
            instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, src1Opnd, m_func);
            instr->AsProfiledInstr()->u.profileId = profileId;
        }
    }
    else
    {
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(src1Opnd);
        if (dstOpnd != nullptr)
        {
            instr->SetDst(dstOpnd);
        }
    }

    if (dstOpnd && newOpcode == Js::OpCode::NewScObject)
    {
        dstOpnd->SetValueType(ValueType::GetObject(ObjectType::UninitializedObject));
    }

    if (symDst && symDst->m_isSingleDef)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::NewScObject:
        case Js::OpCode::NewScObjectSpread:
        case Js::OpCode::NewScObjectLiteral:
        case Js::OpCode::NewScObjArray:
        case Js::OpCode::NewScObjArraySpread:
            symDst->m_isSafeThis = true;
            symDst->m_isNotNumber = true;
            break;
        }
    }

    this->AddInstr(instr, offset);

    this->BuildCallCommon(instr, symDst, ArgCount, flags);

    return instr;
}